

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall ON_Matrix::Multiply(ON_Matrix *this,ON_Matrix *a,ON_Matrix *b)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double **ppdVar4;
  bool bVar5;
  ulong uVar6;
  double ***pppdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  ON_Matrix tmp;
  ON_Matrix OStack_68;
  
  if (((a->m_col_count == b->m_row_count) && (0 < a->m_col_count && 0 < a->m_row_count)) &&
     (0 < b->m_col_count)) {
    if (this == a) {
      ON_Matrix(&OStack_68,a);
      bVar5 = Multiply(this,&OStack_68,b);
    }
    else {
      if (this != b) {
        Create(this,a->m_row_count,b->m_col_count);
        pppdVar7 = &a->m;
        if (a->m_row_count == (a->m_rowmem).m_count) {
          pppdVar7 = &(a->m_rowmem).m_a;
        }
        ppdVar2 = *pppdVar7;
        pppdVar7 = &b->m;
        if (b->m_row_count == (b->m_rowmem).m_count) {
          pppdVar7 = &(b->m_rowmem).m_a;
        }
        ppdVar3 = *pppdVar7;
        uVar1 = this->m_row_count;
        pppdVar7 = &this->m;
        if (uVar1 == (this->m_rowmem).m_count) {
          pppdVar7 = &(this->m_rowmem).m_a;
        }
        uVar9 = 0;
        uVar6 = (ulong)(uint)a->m_col_count;
        if (a->m_col_count < 1) {
          uVar6 = uVar9;
        }
        uVar10 = (ulong)(uint)this->m_col_count;
        if (this->m_col_count < 1) {
          uVar10 = uVar9;
        }
        ppdVar4 = *pppdVar7;
        uVar8 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar8 = uVar9;
        }
        for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
          for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
            dVar13 = 0.0;
            for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
              dVar13 = dVar13 + ppdVar2[uVar9][uVar12] * ppdVar3[uVar12][uVar11];
            }
            ppdVar4[uVar9][uVar11] = dVar13;
          }
        }
        return true;
      }
      ON_Matrix(&OStack_68,b);
      bVar5 = Multiply(this,a,&OStack_68);
    }
    ~ON_Matrix(&OStack_68);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

int ON_Matrix::ColCount() const
{
  return m_col_count;
}